

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void SHA1ProcessMessageBlock(SHA1Context *context)

{
  int iVar1;
  long lVar2;
  uint32_t local_18c;
  uint local_188;
  uint32_t E;
  uint32_t D;
  uint32_t C;
  uint32_t B;
  uint32_t A;
  uint32_t W [80];
  int local_2c;
  uint32_t temp;
  int t;
  uint32_t K [4];
  SHA1Context *context_local;
  
  for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
    (&B)[local_2c] = (uint)context->Message_Block[local_2c << 2] << 0x18;
    (&B)[local_2c] = (uint)context->Message_Block[local_2c * 4 + 1] << 0x10 | (&B)[local_2c];
    (&B)[local_2c] = (uint)context->Message_Block[local_2c * 4 + 2] << 8 | (&B)[local_2c];
    (&B)[local_2c] = (uint)context->Message_Block[local_2c * 4 + 3] | (&B)[local_2c];
  }
  for (local_2c = 0x10; local_2c < 0x50; local_2c = local_2c + 1) {
    (&B)[local_2c] =
         ((&B)[local_2c + -3] ^ (&B)[local_2c + -8] ^ (&B)[local_2c + -0xe] ^ (&B)[local_2c + -0x10]
         ) << 1 | ((&B)[local_2c + -3] ^ (&B)[local_2c + -8] ^ (&B)[local_2c + -0xe] ^
                  (&B)[local_2c + -0x10]) >> 0x1f;
  }
  D = context->Intermediate_Hash[1];
  E = context->Intermediate_Hash[2];
  local_188 = context->Intermediate_Hash[3];
  local_18c = context->Intermediate_Hash[4];
  C = context->Intermediate_Hash[0];
  for (local_2c = 0; local_2c < 0x14; local_2c = local_2c + 1) {
    iVar1 = (C << 5 | C >> 0x1b) + (D & E ^ (D ^ 0xffffffff) & local_188) + local_18c;
    lVar2 = (long)local_2c;
    local_18c = local_188;
    local_188 = E;
    E = D << 0x1e | D >> 2;
    D = C;
    C = iVar1 + (&B)[lVar2] + 0x5a827999;
  }
  for (local_2c = 0x14; local_2c < 0x28; local_2c = local_2c + 1) {
    iVar1 = (C << 5 | C >> 0x1b) + (D ^ E ^ local_188) + local_18c;
    lVar2 = (long)local_2c;
    local_18c = local_188;
    local_188 = E;
    E = D << 0x1e | D >> 2;
    D = C;
    C = iVar1 + (&B)[lVar2] + 0x6ed9eba1;
  }
  for (local_2c = 0x28; local_2c < 0x3c; local_2c = local_2c + 1) {
    iVar1 = (C << 5 | C >> 0x1b) + (D & E ^ D & local_188 ^ E & local_188) + local_18c;
    lVar2 = (long)local_2c;
    local_18c = local_188;
    local_188 = E;
    E = D << 0x1e | D >> 2;
    D = C;
    C = iVar1 + (&B)[lVar2] + 0x8f1bbcdc;
  }
  for (local_2c = 0x3c; local_2c < 0x50; local_2c = local_2c + 1) {
    iVar1 = (C << 5 | C >> 0x1b) + (D ^ E ^ local_188) + local_18c;
    lVar2 = (long)local_2c;
    local_18c = local_188;
    local_188 = E;
    E = D << 0x1e | D >> 2;
    D = C;
    C = iVar1 + (&B)[lVar2] + 0xca62c1d6;
  }
  context->Intermediate_Hash[0] = C + context->Intermediate_Hash[0];
  context->Intermediate_Hash[1] = D + context->Intermediate_Hash[1];
  context->Intermediate_Hash[2] = E + context->Intermediate_Hash[2];
  context->Intermediate_Hash[3] = local_188 + context->Intermediate_Hash[3];
  context->Intermediate_Hash[4] = local_18c + context->Intermediate_Hash[4];
  context->Message_Block_Index = 0;
  return;
}

Assistant:

static void SHA1ProcessMessageBlock(SHA1Context *context)
{
    /* Constants defined in FIPS-180-2, section 4.2.1 */
    const uint32_t K[4] = {
        0x5A827999, 0x6ED9EBA1, 0x8F1BBCDC, 0xCA62C1D6
    };
    int        t;               /* Loop counter */
    uint32_t   temp;            /* Temporary word value */
    uint32_t   W[80];           /* Word sequence */
    uint32_t   A, B, C, D, E;   /* Word buffers */

    /*
    * Initialize the first 16 words in the array W
    */
    for (t = 0; t < 16; t++) {
        W[t] = ((uint32_t)context->Message_Block[t * 4]) << 24;
        W[t] |= ((uint32_t)context->Message_Block[t * 4 + 1]) << 16;
        W[t] |= ((uint32_t)context->Message_Block[t * 4 + 2]) << 8;
        W[t] |= ((uint32_t)context->Message_Block[t * 4 + 3]);
    }

    for (t = 16; t < 80; t++)
        W[t] = SHA1_ROTL(1, W[t - 3] ^ W[t - 8] ^ W[t - 14] ^ W[t - 16]);

    A = context->Intermediate_Hash[0];
    B = context->Intermediate_Hash[1];
    C = context->Intermediate_Hash[2];
    D = context->Intermediate_Hash[3];
    E = context->Intermediate_Hash[4];

    for (t = 0; t < 20; t++) {
        temp = SHA1_ROTL(5, A) + SHA_Ch(B, C, D) + E + W[t] + K[0];
        E = D;
        D = C;
        C = SHA1_ROTL(30, B);
        B = A;
        A = temp;
    }

    for (t = 20; t < 40; t++) {
        temp = SHA1_ROTL(5, A) + SHA_Parity(B, C, D) + E + W[t] + K[1];
        E = D;
        D = C;
        C = SHA1_ROTL(30, B);
        B = A;
        A = temp;
    }

    for (t = 40; t < 60; t++) {
        temp = SHA1_ROTL(5, A) + SHA_Maj(B, C, D) + E + W[t] + K[2];
        E = D;
        D = C;
        C = SHA1_ROTL(30, B);
        B = A;
        A = temp;
    }

    for (t = 60; t < 80; t++) {
        temp = SHA1_ROTL(5, A) + SHA_Parity(B, C, D) + E + W[t] + K[3];
        E = D;
        D = C;
        C = SHA1_ROTL(30, B);
        B = A;
        A = temp;
    }

    context->Intermediate_Hash[0] += A;
    context->Intermediate_Hash[1] += B;
    context->Intermediate_Hash[2] += C;

    context->Intermediate_Hash[3] += D;
    context->Intermediate_Hash[4] += E;

    context->Message_Block_Index = 0;
}